

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.h
# Opt level: O3

void __thiscall CS248::Matrix4x4::Matrix4x4(Matrix4x4 *this,double *data)

{
  double dVar1;
  double *pdVar2;
  int j;
  long lVar3;
  int i;
  long lVar4;
  
  this->entries[3].z = 0.0;
  this->entries[3].w = 0.0;
  this->entries[3].x = 0.0;
  this->entries[3].y = 0.0;
  this->entries[2].z = 0.0;
  this->entries[2].w = 0.0;
  this->entries[2].x = 0.0;
  this->entries[2].y = 0.0;
  this->entries[1].z = 0.0;
  this->entries[1].w = 0.0;
  this->entries[1].x = 0.0;
  this->entries[1].y = 0.0;
  this->entries[0].z = 0.0;
  this->entries[0].w = 0.0;
  this->entries[0].x = 0.0;
  this->entries[0].y = 0.0;
  lVar4 = 0;
  do {
    lVar3 = 0;
    do {
      dVar1 = data[lVar3];
      pdVar2 = operator()(this,(int)lVar4,(int)lVar3);
      *pdVar2 = dVar1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    lVar4 = lVar4 + 1;
    data = data + 4;
  } while (lVar4 != 4);
  return;
}

Assistant:

Matrix4x4(double * data)
  {
    for( int i = 0; i < 4; i++ )
    for( int j = 0; j < 4; j++ )
    {
      // Transpostion happens within the () query.
      (*this)(i,j) = data[i*4 + j];
    }

  }